

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O0

void __thiscall Matrix<int,_6UL,_6UL>::dump(Matrix<int,_6UL,_6UL> *this,ostream *os)

{
  int *piVar1;
  ostream *poVar2;
  uint local_20;
  uint local_1c;
  int j;
  int i;
  ostream *os_local;
  Matrix<int,_6UL,_6UL> *this_local;
  
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
      piVar1 = at(this,(long)(int)local_1c,(long)(int)local_20);
      poVar2 = (ostream *)std::ostream::operator<<(os,*piVar1);
      std::operator<<(poVar2,"\t");
    }
    std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void dump(std::ostream &os) {
    for (int i = 0; i < Row; ++i) {
      for (int j = 0; j < Col; ++j) {
        os << at(i, j) << "\t";
      }
      os << std::endl;
    }
  }